

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

void __thiscall OpenMD::RigidBody::updateAtoms(RigidBody *this,int frame)

{
  Atom *pAVar1;
  bool bVar2;
  long *plVar3;
  uint uVar4;
  ulong uVar5;
  Vector3d pos;
  Vector3d apos;
  Vector3d ref;
  RotMat3x3d a;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  RotMat3x3d local_108;
  SquareMatrix3<double> local_c0;
  SquareMatrix3<double> local_78;
  
  Vector<double,_3U>::Vector(&local_120);
  Vector<double,_3U>::Vector(&local_138);
  StuntDouble::getPos((Vector3d *)&local_150,&this->super_StuntDouble,frame);
  StuntDouble::getA(&local_108,&this->super_StuntDouble,frame);
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    if ((ulong)((long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->atoms_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar5) break;
    StuntDouble::body2Lab
              ((Vector3d *)&local_78,&this->super_StuntDouble,
               (this->refCoords_).
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar5,frame);
    Vector<double,_3U>::operator=(&local_120,(Vector<double,_3U> *)&local_78);
    OpenMD::operator+((Vector<double,_3U> *)&local_78,&local_150,&local_120);
    Vector3<double>::operator=((Vector3<double> *)&local_138,(Vector<double,_3U> *)&local_78);
    StuntDouble::setPos(&(this->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start[uVar5]->super_StuntDouble,
                        (Vector3d *)&local_138,frame);
    bVar2 = Atom::isDirectional((this->atoms_).
                                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar5]);
    if (bVar2) {
      pAVar1 = (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar5];
      if (pAVar1 == (Atom *)0x0) {
        plVar3 = (long *)0x0;
      }
      else {
        plVar3 = (long *)__dynamic_cast(pAVar1,&Atom::typeinfo,&DirectionalAtom::typeinfo,0);
      }
      SquareMatrix3<double>::transpose
                (&local_c0,
                 (this->refOrients_).
                 super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5);
      operator*(&local_78,&local_c0,&local_108);
      (**(code **)(*plVar3 + 0x20))(plVar3,&local_78,frame);
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void RigidBody::updateAtoms(int frame) {
    unsigned int i;
    Vector3d ref;
    Vector3d apos;
    DirectionalAtom* dAtom;
    Vector3d pos = getPos(frame);
    RotMat3x3d a = getA(frame);

    for (i = 0; i < atoms_.size(); i++) {
      ref = body2Lab(refCoords_[i], frame);

      apos = pos + ref;

      atoms_[i]->setPos(apos, frame);

      if (atoms_[i]->isDirectional()) {
        dAtom = dynamic_cast<DirectionalAtom*>(atoms_[i]);
        dAtom->setA(refOrients_[i].transpose() * a, frame);
      }
    }
  }